

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O0

void protodec_getdata(int bufferlen,demod_state_t *d)

{
  unsigned_long uVar1;
  time_t local_30;
  time_t received_t;
  int local_20;
  int k;
  int fillbits;
  uchar type;
  demod_state_t *d_local;
  int bufferlen_local;
  
  _fillbits = d;
  d_local._4_4_ = bufferlen;
  uVar1 = protodec_henten(0,6,d->rbuffer);
  k._3_1_ = (byte)uVar1;
  if ((k._3_1_ != 0) && (k._3_1_ < 0x1c)) {
    local_20 = 0;
    time(&local_30);
    if (0 < d_local._4_4_ % 6) {
      local_20 = 6 - d_local._4_4_ % 6;
      for (received_t._4_4_ = d_local._4_4_; received_t._4_4_ < d_local._4_4_ + local_20;
          received_t._4_4_ = received_t._4_4_ + 1) {
        _fillbits->rbuffer[received_t._4_4_] = '\0';
      }
      d_local._4_4_ = d_local._4_4_ + local_20;
    }
    protodec_generate_nmea(_fillbits,d_local._4_4_,local_20,local_30);
    _fillbits->seqnr = _fillbits->seqnr + '\x01';
    if (9 < _fillbits->seqnr) {
      _fillbits->seqnr = '\0';
    }
  }
  return;
}

Assistant:

void protodec_getdata(int bufferlen, struct demod_state_t *d)
{
	unsigned char type = protodec_henten(0, 6, d->rbuffer);
	if (type < 1 || type > MAX_AIS_PACKET_TYPE /* 9 */)
		return;
//	unsigned long mmsi = protodec_henten(8, 30, d->rbuffer);
	int fillbits = 0;
	int k;
	time_t received_t;
	time(&received_t);
	
	if (bufferlen % 6 > 0) {
		fillbits = 6 - (bufferlen % 6);
		for (k = bufferlen; k < bufferlen + fillbits; k++)
			d->rbuffer[k] = 0;
		
		bufferlen = bufferlen + fillbits;
	}

	protodec_generate_nmea(d, bufferlen, fillbits, received_t);
	
	d->seqnr++;
	if (d->seqnr > 9)
		d->seqnr = 0;
	
	if (type < 1 || type > MAX_AIS_PACKET_TYPE)
		return; // unsupported packet type
}